

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O0

void soul::recurseFindingModules(ModuleBase *m,File *desc,StringDictionary *dictionary)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  pool_ref<soul::AST::ModuleBase> *ppVar3;
  ModuleBase *m_00;
  pool_ref<soul::AST::ModuleBase> *sub;
  pool_ref<soul::AST::ModuleBase> *__end1;
  pool_ref<soul::AST::ModuleBase> *__begin1;
  ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> *local_1e0;
  ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> *__range1;
  value_type *newModule;
  undefined1 local_1c0 [8];
  Module module;
  StringDictionary *dictionary_local;
  File *desc_local;
  ModuleBase *m_local;
  
  module.connections.
  super__Vector_base<soul::SourceCodeModel::Connection,_std::allocator<soul::SourceCodeModel::Connection>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)dictionary;
  bVar1 = pool_ptr<soul::AST::ModuleBase>::operator!=(&m->originalModule,(void *)0x0);
  if (!bVar1) {
    bVar1 = CodeLocation::isEmpty(&m->processorKeywordLocation);
    if (!bVar1) {
      createModule((Module *)local_1c0,m,
                   (StringDictionary *)
                   module.connections.
                   super__Vector_base<soul::SourceCodeModel::Connection,_std::allocator<soul::SourceCodeModel::Connection>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = shouldShow(m,(Module *)local_1c0);
      if (bVar1) {
        std::vector<soul::SourceCodeModel::Module,_std::allocator<soul::SourceCodeModel::Module>_>::
        push_back(&desc->modules,(value_type *)local_1c0);
        __range1 = (ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> *)
                   std::
                   vector<soul::SourceCodeModel::Module,_std::allocator<soul::SourceCodeModel::Module>_>
                   ::back(&desc->modules);
        buildSpecialisationParams
                  (m,(Module *)__range1,
                   (StringDictionary *)
                   module.connections.
                   super__Vector_base<soul::SourceCodeModel::Connection,_std::allocator<soul::SourceCodeModel::Connection>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        buildEndpoints(m,(Module *)__range1,
                       (StringDictionary *)
                       module.connections.
                       super__Vector_base<soul::SourceCodeModel::Connection,_std::allocator<soul::SourceCodeModel::Connection>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        buildFunctions(m,(Module *)__range1,
                       (StringDictionary *)
                       module.connections.
                       super__Vector_base<soul::SourceCodeModel::Connection,_std::allocator<soul::SourceCodeModel::Connection>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        buildVariables(m,(Module *)__range1,
                       (StringDictionary *)
                       module.connections.
                       super__Vector_base<soul::SourceCodeModel::Connection,_std::allocator<soul::SourceCodeModel::Connection>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        buildStructs(m,(Module *)__range1,
                     (StringDictionary *)
                     module.connections.
                     super__Vector_base<soul::SourceCodeModel::Connection,_std::allocator<soul::SourceCodeModel::Connection>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        buildProcessorInstances
                  (m,(Module *)__range1,
                   (StringDictionary *)
                   module.connections.
                   super__Vector_base<soul::SourceCodeModel::Connection,_std::allocator<soul::SourceCodeModel::Connection>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        buildConnections(m,(Module *)__range1,
                         (StringDictionary *)
                         module.connections.
                         super__Vector_base<soul::SourceCodeModel::Connection,_std::allocator<soul::SourceCodeModel::Connection>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      SourceCodeModel::Module::~Module((Module *)local_1c0);
    }
    iVar2 = (*(m->super_Scope)._vptr_Scope[0x11])(&m->super_Scope);
    __begin1 = (pool_ref<soul::AST::ModuleBase> *)CONCAT44(extraout_var,iVar2);
    local_1e0 = (ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> *)&__begin1;
    __end1 = ArrayView<soul::pool_ref<soul::AST::ModuleBase>_>::begin(local_1e0);
    ppVar3 = ArrayView<soul::pool_ref<soul::AST::ModuleBase>_>::end(local_1e0);
    for (; __end1 != ppVar3; __end1 = __end1 + 1) {
      m_00 = pool_ref::operator_cast_to_ModuleBase_((pool_ref *)__end1);
      recurseFindingModules
                (m_00,desc,
                 (StringDictionary *)
                 module.connections.
                 super__Vector_base<soul::SourceCodeModel::Connection,_std::allocator<soul::SourceCodeModel::Connection>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  return;
}

Assistant:

static void recurseFindingModules (AST::ModuleBase& m, SourceCodeModel::File& desc, const StringDictionary& dictionary)
{
    if (m.originalModule != nullptr)
        return;

    // if there's no keyword then it's an outer namespace that was parsed indirectly
    if (! m.processorKeywordLocation.isEmpty())
    {
        auto module = createModule (m, dictionary);

        if (shouldShow (m, module))
        {
            desc.modules.push_back (std::move (module));
            auto& newModule = desc.modules.back();

            buildSpecialisationParams (m, newModule, dictionary);
            buildEndpoints (m, newModule, dictionary);
            buildFunctions (m, newModule, dictionary);
            buildVariables (m, newModule, dictionary);
            buildStructs (m, newModule, dictionary);
            buildProcessorInstances (m, newModule, dictionary);
            buildConnections (m, newModule, dictionary);
        }
    }

    for (auto& sub : m.getSubModules())
        recurseFindingModules (sub, desc, dictionary);
}